

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

locate_result * __thiscall
boost::runtime::cla::parser::locate_parameter
          (locate_result *__return_storage_ptr__,parser *this,trie_ptr *curr_trie,cstring *name,
          cstring *token)

{
  element_type *peVar1;
  parameter_cla_id *ppVar2;
  pointer prVar3;
  bool bVar4;
  pointer psVar5;
  trie_ptr *this_00;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  shared_count sVar9;
  type ppVar10;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *psVar11;
  _Base_ptr p_Var12;
  size_t sVar13;
  pointer psVar14;
  iterator pvVar15;
  pointer prVar16;
  pair<std::_Rb_tree_iterator<const_boost::runtime::parameter_cla_id_*>,_bool> pVar17;
  trie_ptr next_trie;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  typo_candidate_names;
  trie_ptr typo_cand;
  set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
  unique_typo_candidate;
  trie_ptr next_typo_cand;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_1f8;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> local_1d8;
  trie_ptr *local_1c0;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_1b8;
  cstring *local_1a0;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  local_198;
  undefined1 local_178 [8];
  shared_count local_170 [9];
  shared_count local_128;
  iterator local_120;
  iterator local_118;
  _Rb_tree_node_base *local_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f8;
  ulong *local_f0;
  ulong *local_e8;
  undefined8 local_e0;
  undefined1 local_d0 [8];
  shared_count local_c8 [9];
  undefined **local_80;
  char *local_78;
  char *local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  local_1f8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.px = (element_type *)0x0;
  local_1d8.pn.pi_ = (sp_counted_base *)0x0;
  pvVar15 = name->m_begin;
  local_120 = name->m_end;
  bVar4 = true;
  local_1c0 = curr_trie;
  local_1a0 = token;
  local_128.pi_ = (sp_counted_base *)__return_storage_ptr__;
  do {
    if ((!bVar4) || (pvVar15 == local_120)) {
      if (curr_trie->px == (element_type *)0x0) {
        local_198.
        super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198.
        super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_f0 = &uStack_100;
        uStack_100 = uStack_100 & 0xffffffff00000000;
        local_f8 = 0;
        local_e0 = 0;
        local_e8 = local_f0;
        std::
        vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
        ::reserve(&local_198,
                  (long)local_1f8.
                        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1f8.
                        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
        psVar5 = local_1f8.
                 super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = true;
        for (psVar14 = local_1f8.
                       super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; (bVar4 && (psVar14 != psVar5));
            psVar14 = psVar14 + 1) {
          local_178 = (undefined1  [8])psVar14->px;
          local_170[0].pi_ = (psVar14->pn).pi_;
          if (local_170[0].pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_170[0].pi_)->use_count_ = (local_170[0].pi_)->use_count_ + 1;
            UNLOCK();
          }
          bVar4 = false;
          while (!bVar4) {
            ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                                 local_178);
            bVar4 = true;
            if ((ulong)((long)(ppVar10->m_id_candidates).
                              super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ppVar10->m_id_candidates).
                             super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 9) {
              ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                  ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *
                                   )local_178);
              shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                        ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)local_178
                        );
              prVar16 = (ppVar10->m_id_candidates).
                        super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                  ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *
                                   )local_178);
              shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                        ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)local_178
                        );
              prVar3 = (ppVar10->m_id_candidates).
                       super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              while( true ) {
                shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                           local_178);
                shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                           local_178);
                if (prVar16 == prVar3) break;
                shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                           local_178);
                shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                           local_178);
                ppVar2 = prVar16->t_;
                local_d0 = (undefined1  [8])ppVar2;
                pVar17 = std::
                         _Rb_tree<boost::runtime::parameter_cla_id_const*,boost::runtime::parameter_cla_id_const*,std::_Identity<boost::runtime::parameter_cla_id_const*>,std::less<boost::runtime::parameter_cla_id_const*>,std::allocator<boost::runtime::parameter_cla_id_const*>>
                         ::_M_insert_unique<boost::runtime::parameter_cla_id_const*>
                                   ((_Rb_tree<boost::runtime::parameter_cla_id_const*,boost::runtime::parameter_cla_id_const*,std::_Identity<boost::runtime::parameter_cla_id_const*>,std::less<boost::runtime::parameter_cla_id_const*>,std::allocator<boost::runtime::parameter_cla_id_const*>>
                                     *)&local_108,(parameter_cla_id **)local_d0);
                if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  local_d0 = (undefined1  [8])(ppVar2->m_tag)._M_dataplus._M_p;
                  local_c8[0].pi_ =
                       (sp_counted_base *)
                       ((long)&(((parameter_cla_id *)local_d0)->m_prefix)._M_dataplus._M_p +
                       (ppVar2->m_tag)._M_string_length);
                  std::
                  vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
                  ::emplace_back<boost::unit_test::basic_cstring<char_const>>
                            ((vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
                              *)&local_198,(basic_cstring<const_char> *)local_d0);
                }
                shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                           local_178);
                shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                           local_178);
                prVar16 = prVar16 + 1;
              }
              bVar4 = true;
            }
          }
          detail::shared_count::~shared_count(local_170);
        }
        sVar13 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length("");
        local_70 = "\t" + sVar13 + 1;
        local_68._M_p = (pointer)&local_58;
        local_78 = "";
        local_60 = 0;
        local_58._M_local_buf[0] = '\0';
        local_80 = &PTR__unrecognized_param_001e1db8;
        local_48 = local_198.
                   super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbStack_40 = local_198.
                     super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_38 = local_198.
                   super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_198.
        super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198.
        super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::
        operator<<((unrecognized_param *)local_d0,
                   (specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                    *)&local_80,"An unrecognized parameter in the argument ");
        specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error>::
        operator<<((unrecognized_param *)local_178,
                   (specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error>
                    *)local_d0,local_1a0);
        unit_test::ut_detail::throw_exception<boost::runtime::unrecognized_param>
                  ((unrecognized_param *)local_178);
      }
      ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          (curr_trie);
      if ((ulong)((long)(ppVar10->m_id_candidates).
                        super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(ppVar10->m_id_candidates).
                       super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 9) {
        ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                            (curr_trie);
        ppVar2 = (ppVar10->m_id_candidates).
                 super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].t_;
        ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                            (curr_trie);
        sVar9.pi_ = local_128.pi_;
        std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
        ::pair<boost::shared_ptr<boost::runtime::basic_param>_&,_true>
                  ((pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
                    *)local_128.pi_,ppVar2,&ppVar10->m_param_candidate);
        detail::shared_count::~shared_count(&local_1d8.pn);
        std::
        vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ::~vector(&local_1b8);
        std::
        vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ::~vector(&local_1f8);
        return (locate_result *)sVar9.pi_;
      }
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          (curr_trie);
      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
      prVar16 = (ppVar10->m_id_candidates).
                super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                          (curr_trie);
      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
      prVar3 = (ppVar10->m_id_candidates).
               super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
        shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
        if (prVar16 == prVar3) break;
        shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
        shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
        local_178 = (undefined1  [8])(prVar16->t_->m_tag)._M_dataplus._M_p;
        local_170[0].pi_ =
             (sp_counted_base *)
             (&(((element_type *)local_178)->m_subtrie)._M_t._M_impl.field_0x0 +
             (prVar16->t_->m_tag)._M_string_length);
        std::
        vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
        ::emplace_back<boost::unit_test::basic_cstring<char_const>>
                  ((vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
                    *)&local_108,(basic_cstring<const_char> *)local_178);
        shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
        shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
        prVar16 = prVar16 + 1;
      }
      sVar13 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length("");
      local_70 = "\t" + sVar13 + 1;
      local_68._M_p = (pointer)&local_58;
      local_78 = "";
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      local_80 = &PTR__ambiguous_param_001e1e08;
      local_48 = (pointer)local_108;
      pbStack_40 = (pointer)uStack_100;
      local_38 = (pointer)local_f8;
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>::operator<<
                ((ambiguous_param *)local_d0,
                 (specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                  *)&local_80,"An ambiguous parameter name in the argument ");
      specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>::operator<<
                ((ambiguous_param *)local_178,
                 (specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>
                  *)local_d0,local_1a0);
      unit_test::ut_detail::throw_exception<boost::runtime::ambiguous_param>
                ((ambiguous_param *)local_178);
    }
    bVar4 = false;
    local_118 = pvVar15;
    while (psVar5 = local_1f8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, !bVar4) {
      if (curr_trie->px == (element_type *)0x0) {
        bVar4 = true;
        for (psVar14 = local_1f8.
                       super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            (psVar8 = local_1b8.
                      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
            psVar7 = local_1b8.
                     super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            psVar6 = local_1b8.
                     super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, bVar4 && (psVar14 != psVar5));
            psVar14 = psVar14 + 1) {
          local_178 = (undefined1  [8])psVar14->px;
          local_170[0].pi_ = (psVar14->pn).pi_;
          if (local_170[0].pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_170[0].pi_)->use_count_ = (local_170[0].pi_)->use_count_ + 1;
            UNLOCK();
          }
          bVar4 = false;
          while (!bVar4) {
            ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                                 local_178);
            rt_cla_detail::parameter_trie::get_subtrie((parameter_trie *)local_d0,(char)ppVar10);
            if (local_d0 != (undefined1  [8])0x0) {
              std::
              vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ::push_back(&local_1b8,(value_type *)local_d0);
            }
            detail::shared_count::~shared_count(local_c8);
            bVar4 = true;
          }
          detail::shared_count::~shared_count(local_170);
        }
        local_1b8.
        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1f8.
             super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1b8.
        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_1f8.
             super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1b8.
        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1f8.
             super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1f8.
        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ._M_impl.super__Vector_impl_data._M_start = psVar6;
        local_1f8.
        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar7;
        local_1f8.
        super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar8;
        std::
        vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
        ::clear(&local_1b8);
        bVar4 = true;
        curr_trie = local_1c0;
      }
      else {
        ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                            (curr_trie);
        rt_cla_detail::parameter_trie::get_subtrie((parameter_trie *)local_178,(char)ppVar10);
        shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator=
                  (&local_1d8,
                   (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)local_178);
        detail::shared_count::~shared_count(local_170);
        if (local_1d8.px == (element_type *)0x0) {
          ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                              (curr_trie);
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
          p_Var12 = (ppVar10->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                              (curr_trie);
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
          local_110 = &(ppVar10->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header;
          bVar4 = true;
          while (curr_trie = local_1c0, bVar4) {
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(local_1c0);
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
            if (p_Var12 == local_110) break;
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(curr_trie);
            bVar4 = false;
            while (this_00 = local_1c0, !bVar4) {
              std::
              vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ::push_back(&local_1f8,(value_type *)&p_Var12[1]._M_parent);
              ppVar10 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                  ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *
                                   )&p_Var12[1]._M_parent);
              rt_cla_detail::parameter_trie::get_subtrie((parameter_trie *)local_178,(char)ppVar10);
              psVar11 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator=
                                  (&local_1d8,
                                   (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *
                                   )local_178);
              peVar1 = psVar11->px;
              detail::shared_count::~shared_count(local_170);
              bVar4 = true;
              if (peVar1 != (element_type *)0x0) {
                std::
                vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                ::push_back(&local_1f8,&local_1d8);
              }
            }
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(local_1c0);
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->(this_00);
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
          }
          std::
          vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
          ::push_back(&local_1f8,curr_trie);
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::reset(curr_trie);
          bVar4 = true;
        }
        else {
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator=
                    (curr_trie,&local_1d8);
          bVar4 = true;
        }
      }
    }
    pvVar15 = local_118 + 1;
  } while( true );
}

Assistant:

locate_result
    locate_parameter( trie_ptr curr_trie, cstring name, cstring token )
    {
        std::vector<trie_ptr> typo_candidates;
        std::vector<trie_ptr> next_typo_candidates;
        trie_ptr next_trie;

        BOOST_TEST_FOREACH( char, c, name ) {
            if( curr_trie ) {
                // locate next subtrie corresponding to the char
                next_trie = curr_trie->get_subtrie( c );

                if( next_trie )
                    curr_trie = next_trie;
                else {
                    // Initiate search for typo candicates. We will account for 'wrong char' typo
                    // 'missing char' typo and 'extra char' typo
                    BOOST_TEST_FOREACH( trie_per_char::value_type const&, typo_cand, curr_trie->m_subtrie ) {
                        // 'wrong char' typo
                        typo_candidates.push_back( typo_cand.second );

                        // 'missing char' typo
                        if( (next_trie = typo_cand.second->get_subtrie( c )) )
                            typo_candidates.push_back( next_trie );
                    }

                    // 'extra char' typo
                    typo_candidates.push_back( curr_trie );

                    curr_trie.reset();
                }
            }
            else {
                // go over existing typo candidates and see if they are still viable
                BOOST_TEST_FOREACH( trie_ptr, typo_cand, typo_candidates ) {
                    trie_ptr next_typo_cand = typo_cand->get_subtrie( c );

                    if( next_typo_cand )
                        next_typo_candidates.push_back( next_typo_cand );
                }

                next_typo_candidates.swap( typo_candidates );
                next_typo_candidates.clear();
            }
        }

        if( !curr_trie ) {
            std::vector<cstring> typo_candidate_names;
            std::set<parameter_cla_id const*> unique_typo_candidate; // !! ?? unordered_set
            typo_candidate_names.reserve( typo_candidates.size() );
// !! ??            unique_typo_candidate.reserve( typo_candidates.size() );

            BOOST_TEST_FOREACH( trie_ptr, trie_cand, typo_candidates ) {
                // avoid ambiguos candidate trie
                if( trie_cand->m_id_candidates.size() > 1 )
                    continue;

                BOOST_TEST_FOREACH( parameter_cla_id const&, param_cand, trie_cand->m_id_candidates ) {
                    if( !unique_typo_candidate.insert( &param_cand ).second )
                        continue;

                    typo_candidate_names.push_back( param_cand.m_tag );
                }
            }

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( unrecognized_param( std::move(typo_candidate_names) )
                                << "An unrecognized parameter in the argument "
                                << token );
#else
            BOOST_TEST_I_THROW( unrecognized_param( typo_candidate_names )
                                << "An unrecognized parameter in the argument "
                                << token );
#endif
        }

        if( curr_trie->m_id_candidates.size() > 1 ) {
            std::vector<cstring> amb_names;
            BOOST_TEST_FOREACH( parameter_cla_id const&, param_id, curr_trie->m_id_candidates )
                amb_names.push_back( param_id.m_tag );

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( ambiguous_param( std::move( amb_names ) )
                                << "An ambiguous parameter name in the argument " << token );
#else
            BOOST_TEST_I_THROW( ambiguous_param( amb_names )
                                << "An ambiguous parameter name in the argument " << token );
#endif
        }

        return locate_result( curr_trie->m_id_candidates.back().get(), curr_trie->m_param_candidate );
    }